

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPlugin.cpp
# Opt level: O0

void CppUTestStore(void **function)

{
  UtestShell *this;
  void **in_RDI;
  undefined8 local_10;
  void **local_8;
  
  local_8 = in_RDI;
  if (0x1f < pointerTableIndex) {
    this = UtestShell::getCurrent();
    local_10 = 0;
    NormalTestTerminator::NormalTestTerminator((NormalTestTerminator *)this);
    (*this->_vptr_UtestShell[0x1a])
              (this,"Maximum number of function pointers installed!",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O0/CMake/cpputest/cpputest-src/src/CppUTest/TestPlugin.cpp"
               ,0x88,&local_10);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x180c3b);
  }
  setlist[pointerTableIndex].orig_value = *local_8;
  setlist[pointerTableIndex].orig = local_8;
  pointerTableIndex = pointerTableIndex + 1;
  return;
}

Assistant:

void CppUTestStore(void**function)
{
    if (pointerTableIndex >= SetPointerPlugin::MAX_SET) {
        FAIL("Maximum number of function pointers installed!");
    }
    setlist[pointerTableIndex].orig_value = *function;
    setlist[pointerTableIndex].orig = function;
    pointerTableIndex++;
}